

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer.c
# Opt level: O1

int aom_uleb_encode(uint64_t value,size_t available,uint8_t *coded_value,size_t *coded_size)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  size_t i;
  size_t sVar4;
  ulong uVar5;
  uint64_t uVar7;
  ulong uVar6;
  
  uVar5 = 0;
  uVar7 = value;
  do {
    uVar6 = uVar5;
    uVar5 = uVar6 + 1;
    bVar1 = 0x7f < uVar7;
    uVar7 = uVar7 >> 7;
  } while (bVar1);
  iVar3 = -1;
  if ((((uVar6 < 8 && value >> 0x20 == 0) && (coded_size != (size_t *)0x0)) &&
      (coded_value != (uint8_t *)0x0)) && (uVar6 < available)) {
    sVar4 = 0;
    do {
      bVar1 = 0x7f < value;
      bVar2 = (byte)value;
      value = value >> 7;
      coded_value[sVar4] = bVar1 << 7 | bVar2 & 0x7f;
      sVar4 = sVar4 + 1;
    } while (uVar5 != sVar4);
    *coded_size = uVar5;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int aom_uleb_encode(uint64_t value, size_t available, uint8_t *coded_value,
                    size_t *coded_size) {
  const size_t leb_size = aom_uleb_size_in_bytes(value);
  if (value > kMaximumLeb128Value || leb_size > kMaximumLeb128Size ||
      leb_size > available || !coded_value || !coded_size) {
    return -1;
  }

  for (size_t i = 0; i < leb_size; ++i) {
    uint8_t byte = value & 0x7f;
    value >>= 7;

    if (value != 0) byte |= 0x80;  // Signal that more bytes follow.

    *(coded_value + i) = byte;
  }

  *coded_size = leb_size;
  return 0;
}